

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O2

void rotateImage(Mat *input,Mat *output,double alpha,double beta,double gamma,double dx,double dy,
                double dz,double f)

{
  int iVar1;
  int iVar2;
  MatCommaInitializer_<double> *pMVar3;
  MatCommaInitializer_ *pMVar4;
  int val;
  int val_00;
  int val_01;
  double dVar5;
  double dVar6;
  undefined8 local_790;
  _OutputArray local_788;
  undefined4 local_770 [2];
  Mat *local_768;
  undefined8 local_760;
  Mat bordered;
  undefined8 *local_718;
  undefined1 local_5f8 [16];
  double local_5e8;
  double dStack_5e0;
  MatCommaInitializer_<double> local_490 [8];
  Mat trans;
  Mat A2;
  Mat T;
  Mat R;
  Mat RZ;
  Mat RY;
  Mat RX;
  Mat A1;
  
  iVar1 = *(int *)(input + 0xc);
  iVar2 = *(int *)(input + 8);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_5f8,4,3);
  cv::operator<<(local_490,(Mat_<double> *)local_5f8,val);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(local_490,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar1 * -0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar2 * -0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)&bordered,pMVar4);
  cv::Mat::Mat(&A1,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)local_5f8);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_5f8,4,4);
  cv::operator<<(local_490,(Mat_<double> *)local_5f8,val_00);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(local_490,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar5 = (alpha * 3.141592653589793) / 180.0;
  dVar6 = cos(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar6);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,-dVar6);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar6);
  dVar5 = cos(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)&bordered,pMVar4);
  cv::Mat::Mat(&RX,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)local_5f8);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_5f8,4,4);
  dVar5 = (beta * 3.141592653589793) / 180.0;
  dVar6 = cos(dVar5);
  cv::operator<<(local_490,(Mat_<double> *)local_5f8,dVar6);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(local_490,0);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,-dVar6);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar6);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar5 = cos(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)&bordered,pMVar4);
  cv::Mat::Mat(&RY,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)local_5f8);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_5f8,4,4);
  dVar5 = (gamma * 3.141592653589793) / 180.0;
  dVar6 = cos(dVar5);
  cv::operator<<(local_490,(Mat_<double> *)local_5f8,dVar6);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(local_490,-dVar6);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  dVar6 = sin(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar6);
  dVar5 = cos(dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dVar5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)&bordered,pMVar4);
  cv::Mat::Mat(&RZ,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)local_5f8);
  cv::operator*((Mat *)local_5f8,&RX);
  cv::operator*((MatExpr *)&bordered,(Mat *)local_5f8);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&R);
  cv::MatExpr::~MatExpr((MatExpr *)&bordered);
  cv::MatExpr::~MatExpr((MatExpr *)local_5f8);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_5f8,4,4);
  cv::operator<<(local_490,(Mat_<double> *)local_5f8,val_01);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(local_490,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dx);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dy);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,dz);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)&bordered,pMVar4);
  cv::Mat::Mat(&T,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)local_5f8);
  cv::Mat_<double>::Mat_((Mat_<double> *)local_5f8,3,4);
  cv::operator<<(local_490,(Mat_<double> *)local_5f8,f);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(local_490,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar1 * 0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,f);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,(double)iVar2 * 0.5);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  pMVar3 = cv::MatCommaInitializer_<double>::operator_(pMVar3,1);
  pMVar4 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar3,0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)&bordered,pMVar4);
  cv::Mat::Mat(&A2,&bordered);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat((Mat *)local_5f8);
  cv::operator*((Mat *)local_490,&R);
  cv::operator*((Mat *)local_5f8,(MatExpr *)&T);
  cv::operator*(&bordered,(MatExpr *)&A2);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)&trans);
  cv::MatExpr::~MatExpr((MatExpr *)&bordered);
  cv::MatExpr::~MatExpr((MatExpr *)local_5f8);
  cv::MatExpr::~MatExpr((MatExpr *)local_490);
  cv::Mat::Mat(&bordered);
  local_490[0].it.super_MatConstIterator_<double>.super_MatConstIterator.ptr = (uchar *)0x0;
  local_490[0].it.super_MatConstIterator_<double>.super_MatConstIterator.m._0_4_ = 0x1010000;
  local_788.super__InputArray.sz.width = 0;
  local_788.super__InputArray.sz.height = 0;
  local_788.super__InputArray.flags = 0x2010000;
  iVar1 = *(int *)(input + 8);
  iVar2 = *(int *)(input + 0xc);
  local_788.super__InputArray.obj = (MatExpr *)&bordered;
  local_490[0].it.super_MatConstIterator_<double>.super_MatConstIterator.elemSize = (size_t)input;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_5f8);
  local_5e8 = 0.0;
  dStack_5e0 = 0.0;
  local_5f8._0_8_ = 0.0;
  local_5f8._8_8_ = 0.0;
  cv::copyMakeBorder((_InputArray *)local_490,&local_788,iVar1,iVar1,(int)((double)iVar2 * 0.3),
                     (int)((double)iVar2 * 0.3),0,(Scalar_ *)local_5f8);
  local_490[0].it.super_MatConstIterator_<double>.super_MatConstIterator.ptr = (uchar *)0x0;
  local_490[0].it.super_MatConstIterator_<double>.super_MatConstIterator.m._0_4_ = 0x1010000;
  local_788.super__InputArray.sz.width = 0;
  local_788.super__InputArray.sz.height = 0;
  local_760 = 0;
  local_788.super__InputArray.flags = 0x2010000;
  local_770[0] = 0x1010000;
  local_768 = &trans;
  local_790 = CONCAT44((int)*local_718,(int)((ulong)*local_718 >> 0x20));
  local_788.super__InputArray.obj = output;
  local_490[0].it.super_MatConstIterator_<double>.super_MatConstIterator.elemSize =
       (size_t)&bordered;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_5f8);
  cv::warpPerspective(local_490,&local_788,local_770,&local_790,4,0,(Scalar_<double> *)local_5f8);
  cv::Mat::~Mat(&bordered);
  cv::Mat::~Mat(&trans);
  cv::Mat::~Mat(&A2);
  cv::Mat::~Mat(&T);
  cv::Mat::~Mat(&R);
  cv::Mat::~Mat(&RZ);
  cv::Mat::~Mat(&RY);
  cv::Mat::~Mat(&RX);
  cv::Mat::~Mat(&A1);
  return;
}

Assistant:

void rotateImage(const cv::Mat &input,cv::Mat &output, double alpha, double beta, double gamma, double dx, double dy, double dz, double f) {
    alpha = (alpha)*CV_PI/180.;
    beta = (beta)*CV_PI/180.;
    gamma = (gamma)*CV_PI/180.;
    // get width and height for ease of use in cv::Matrices
    double w = (double)input.cols;
    double h = (double)input.rows;
    // Projection 2D -> 3D cv::Matrix
    cv::Mat A1 = (cv::Mat_<double>(4,3) <<
              1, 0, -w/2.,
              0, 1, -h/2.,
              0, 0, 0,
              0, 0, 1);
    // Rotation cv::Matrices around the X, Y, and Z axis
    cv::Mat RX = (cv::Mat_<double>(4, 4) <<
              1,          0,           0, 0,
              0, cos(alpha), -sin(alpha), 0,
              0, sin(alpha),  cos(alpha), 0,
              0,          0,           0, 1);
    cv::Mat RY = (cv::Mat_<double>(4, 4) <<
              cos(beta), 0, -sin(beta), 0,
              0, 1,          0, 0,
              sin(beta), 0,  cos(beta), 0,
              0, 0,          0, 1);
    cv::Mat RZ = (cv::Mat_<double>(4, 4) <<
              cos(gamma), -sin(gamma), 0, 0,
              sin(gamma),  cos(gamma), 0, 0,
              0,          0,           1, 0,
              0,          0,           0, 1);
    // Composed rotation cv::Matrix with (RX, RY, RZ)
    cv::Mat R = RX * RY * RZ;
    // Translation cv::Matrix
    cv::Mat T = (cv::Mat_<double>(4, 4) <<
             1, 0, 0, dx,
             0, 1, 0, dy,
             0, 0, 1, dz,
             0, 0, 0, 1);
    // 3D -> 2D cv::Matrix
    cv::Mat A2 = (cv::Mat_<double>(3,4) <<
              f, 0, w/2, 0,
              0, f, h/2, 0,
              0, 0,   1, 0);
    // Final transforcv::Mation cv::Matrix
    cv::Mat trans = A2 * (T * (R * A1));
    // Apply cv::Matrix transforcv::Mation
    cv::Mat bordered;
    cv::copyMakeBorder(input, bordered, input.rows, input.rows, input.cols*.3, input.cols*.3, cv::BORDER_CONSTANT, cv::Scalar(0,0,0));
    cv::warpPerspective(bordered, output, trans, bordered.size(), cv::INTER_LANCZOS4);
}